

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReceiverPdu.cpp
# Opt level: O1

void __thiscall DIS::ReceiverPdu::unmarshal(ReceiverPdu *this,DataStream *dataStream)

{
  RadioCommunicationsFamilyPdu::unmarshal(&this->super_RadioCommunicationsFamilyPdu,dataStream);
  DataStream::operator>>
            (dataStream,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2a);
  DataStream::operator>>
            (dataStream,(unsigned_short *)&(this->super_RadioCommunicationsFamilyPdu).field_0x2c);
  DataStream::operator>>(dataStream,&this->_receivedPower);
  EntityID::unmarshal(&this->_transmitterEntityId,dataStream);
  DataStream::operator>>(dataStream,&this->_transmitterRadioId);
  return;
}

Assistant:

void ReceiverPdu::unmarshal(DataStream& dataStream)
{
    RadioCommunicationsFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    dataStream >> _receiverState;
    dataStream >> _padding1;
    dataStream >> _receivedPower;
    _transmitterEntityId.unmarshal(dataStream);
    dataStream >> _transmitterRadioId;
}